

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

string * perfetto::base::ToLower(string *__return_storage_ptr__,string *str)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  size_type sVar4;
  char cVar5;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  sVar3 = __return_storage_ptr__->_M_string_length;
  for (sVar4 = 0; sVar3 != sVar4; sVar4 = sVar4 + 1) {
    cVar1 = pcVar2[sVar4];
    cVar5 = cVar1 + ' ';
    if (0x19 < (byte)(cVar1 + 0xbfU)) {
      cVar5 = cVar1;
    }
    pcVar2[sVar4] = cVar5;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToLower(const std::string& str) {
  // Don't use tolower(), it depends on the locale.
  std::string res(str);
  auto end = res.end();
  for (auto c = res.begin(); c != end; ++c)
    *c = Lowercase(*c);
  return res;
}